

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.h
# Opt level: O0

basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node> * __thiscall
llvm::yaml::basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::operator++
          (basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node> *this)

{
  basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node> *this_local;
  
  if (this->Base == (SequenceNode *)0x0) {
    __assert_fail("Base && \"Attempted to advance iterator past end!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/YAMLParser.h"
                  ,0x16f,
                  "basic_collection_iterator<BaseT, ValueT> &llvm::yaml::basic_collection_iterator<llvm::yaml::SequenceNode, llvm::yaml::Node>::operator++() [BaseT = llvm::yaml::SequenceNode, ValueT = llvm::yaml::Node]"
                 );
  }
  SequenceNode::increment(this->Base);
  if (this->Base->CurrentEntry == (Node *)0x0) {
    this->Base = (SequenceNode *)0x0;
  }
  return this;
}

Assistant:

basic_collection_iterator &operator++() {
    assert(Base && "Attempted to advance iterator past end!");
    Base->increment();
    // Create an end iterator.
    if (!Base->CurrentEntry)
      Base = nullptr;
    return *this;
  }